

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>,_3,_0,_0>
     ::run(Matrix<double,__1,_1,_0,_2,_1> *dst,
          CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
          *src)

{
  Index index_00;
  Matrix<double,__1,_1,_0,_2,_1> *dst_00;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *in_RSI;
  Matrix<double,__1,_1,_0,_2,_1> *in_RDI;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  Index in_stack_ffffffffffffffc8;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_> *in_stack_ffffffffffffffd0;
  long start;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *src_00;
  
  index_00 = EigenBase<Eigen::Matrix<double,_-1,_1,_0,_2,_1>_>::size(in_stack_ffffffffffffffd0);
  src_00 = (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
            *)0x0;
  dst_00 = (Matrix<double,__1,_1,_0,_2,_1> *)((index_00 / 2) * 2);
  unaligned_assign_impl<true>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const>,Eigen::Matrix<double,_1,1,0,2,1>>
            (in_RSI,in_RDI,0,0);
  for (start = 0; start < (long)dst_00; start = start + 2) {
    DenseCoeffsBase<Eigen::Matrix<double,-1,1,0,2,1>,1>::
    copyPacket<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const>,1,0>
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_1> *)in_RSI,index_00,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>_>
                *)src_00);
  }
  unaligned_assign_impl<false>::
  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const>,Eigen::Matrix<double,_1,1,0,2,1>>
            (src_00,dst_00,start,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Derived1 &dst, const Derived2 &src)
  {
    const Index size = dst.size();
    typedef packet_traits<typename Derived1::Scalar> PacketTraits;
    enum {
      packetSize = PacketTraits::size,
      dstAlignment = PacketTraits::AlignedOnScalar ? Aligned : int(assign_traits<Derived1,Derived2>::DstIsAligned) ,
      srcAlignment = assign_traits<Derived1,Derived2>::JointAlignment
    };
    const Index alignedStart = assign_traits<Derived1,Derived2>::DstIsAligned ? 0
                             : internal::first_aligned(&dst.coeffRef(0), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_assign_impl<assign_traits<Derived1,Derived2>::DstIsAligned!=0>::run(src,dst,0,alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
    {
      dst.template copyPacket<Derived2, dstAlignment, srcAlignment>(index, src);
    }

    unaligned_assign_impl<>::run(src,dst,alignedEnd,size);
  }